

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_sink-inl.h
# Opt level: O1

double __thiscall spdlog::sinks::base_sink<std::mutex>::log(base_sink<std::mutex> *this,double __x)

{
  int iVar1;
  double extraout_XMM0_Qa;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
  if (iVar1 == 0) {
    (*(this->super_sink)._vptr_sink[6])(this);
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
    return extraout_XMM0_Qa;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void SPDLOG_INLINE spdlog::sinks::base_sink<Mutex>::log(const details::log_msg &msg)
{
    std::lock_guard<Mutex> lock(mutex_);
    sink_it_(msg);
}